

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

ON_ModelComponentReference __thiscall
ONX_Model::RemoveModelComponent(ONX_Model *this,Type component_type,ON_UUID component_id)

{
  ONX_ModelComponentReferenceLink *mcr_link;
  ON__UINT8 OVar1;
  ON__UINT16 OVar2;
  bool bVar3;
  Type TVar4;
  ON_ComponentManifestItem *pOVar5;
  ON__UINT64 sn;
  SN_ELEMENT *pSVar6;
  long lVar7;
  char *sFormat;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  int line_number;
  undefined7 in_register_00000031;
  ONX_Model *this_00;
  ON_ComponentManifestItem *pOVar9;
  uchar in_R8 [8];
  byte bVar10;
  ON_UUID OVar11;
  ON_ModelComponentReference OVar12;
  ON_ComponentManifestItem item;
  ON_ComponentManifestItem local_70;
  
  this_00 = (ONX_Model *)CONCAT71(in_register_00000031,component_type);
  bVar10 = 0;
  OVar11.Data4 = in_R8;
  OVar11._0_8_ = component_id.Data4;
  pOVar5 = ON_ComponentManifest::ItemFromId(&this_00->m_manifest,OVar11);
  pOVar9 = &local_70;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    TVar4 = pOVar5->m_component_type;
    OVar1 = pOVar5->m_reserved1;
    OVar2 = pOVar5->m_reserved2;
    pOVar9->m_status_bits = pOVar5->m_status_bits;
    pOVar9->m_component_type = TVar4;
    pOVar9->m_reserved1 = OVar1;
    pOVar9->m_reserved2 = OVar2;
    pOVar5 = (ON_ComponentManifestItem *)((long)pOVar5 + (ulong)bVar10 * -0x10 + 8);
    pOVar9 = (ON_ComponentManifestItem *)((long)pOVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  bVar3 = ON_ComponentManifestItem::IsUnset(&local_70);
  if (bVar3) {
    sFormat = "Invalid component_id parameter.";
    line_number = 0x47a;
  }
  else {
    if ((Type)component_id.Data1 != Unset) {
      TVar4 = ON_ComponentManifestItem::ComponentType(&local_70);
      if (TVar4 != (Type)component_id.Data1) {
        sFormat = "Invalid model_component type.";
        line_number = 0x47f;
        goto LAB_004611e9;
      }
    }
    OVar11 = ON_ComponentManifestItem::Id(&local_70);
    bVar3 = ON_ComponentManifest::RemoveComponent(&this_00->m_manifest,OVar11);
    if (bVar3) {
      sn = ON_ComponentManifestItem::ComponentRuntimeSerialNumber(&local_70);
      pSVar6 = ON_SerialNumberMap::FindSerialNumber(&this_00->m_mcr_sn_map,sn);
      if ((pSVar6 != (SN_ELEMENT *)0x0) &&
         (mcr_link = (ONX_ModelComponentReferenceLink *)(pSVar6->m_value).m_u.ptr,
         mcr_link != (ONX_ModelComponentReferenceLink *)0x0)) {
        ON_ModelComponentReference::ON_ModelComponentReference
                  ((ON_ModelComponentReference *)this,(ON_ModelComponentReference *)mcr_link);
        Internal_RemoveModelComponentReferenceLink(this_00,mcr_link);
        _Var8._M_pi = extraout_RDX;
        goto LAB_004611ff;
      }
      sFormat = "component not in model.";
      line_number = 0x48b;
    }
    else {
      sFormat = "Unable to remove component from manifest.";
      line_number = 0x484;
    }
  }
LAB_004611e9:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,line_number,"",sFormat);
  ON_ModelComponentReference::ON_ModelComponentReference
            ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
  _Var8._M_pi = extraout_RDX_00;
LAB_004611ff:
  OVar12.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  OVar12.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar12.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::RemoveModelComponent(
  ON_ModelComponent::Type component_type,
  ON_UUID component_id
  )
{
  const ON_ComponentManifestItem item = m_manifest.ItemFromId(component_id);
  if (item.IsUnset())
  {
    ON_ERROR("Invalid component_id parameter.");
    return ON_ModelComponentReference::Empty;
  }
  if (ON_ModelComponent::Type::Unset != component_type && component_type != item.ComponentType())
  {
    ON_ERROR("Invalid model_component type.");
    return ON_ModelComponentReference::Empty;
  }
  if (!m_manifest.RemoveComponent(item.Id()))
  {
    ON_ERROR("Unable to remove component from manifest.");
    return ON_ModelComponentReference::Empty;
  }

  ONX_ModelComponentReferenceLink* mcr_link = Internal_ModelComponentLinkFromSerialNumber(item.ComponentRuntimeSerialNumber());
  if (nullptr == mcr_link)
  {
    ON_ERROR("component not in model.");
    return ON_ModelComponentReference::Empty;
  }
  ON_ModelComponentReference mcr = mcr_link->m_mcr;
  Internal_RemoveModelComponentReferenceLink(mcr_link);
  return mcr;
}